

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RAM.c
# Opt level: O1

uint8_t read_RAM(uint16_t address)

{
  uint8_t uVar1;
  uint uVar2;
  ushort uVar3;
  
  if ((ushort)(address + 0xdff8) < 0x1ff8) {
    uVar3 = address & 0x2007;
  }
  else {
    uVar3 = address & 0x7ff;
    if (0x17ff < (ushort)(address - 0x800)) {
      uVar3 = address;
    }
  }
  uVar2 = (uint)uVar3;
  uVar1 = RAM[uVar2];
  if (uVar2 < 0x2007) {
    if (uVar2 == 0x2002) {
      RAM[0x2002] = RAM[0x2002] & 0x7f;
      clear_write_toggle();
    }
    else if (uVar2 == 0x2004) {
      uVar1 = get_OAM_data();
      return uVar1;
    }
  }
  else if (uVar2 == 0x2007) {
    uVar1 = PPUDATA_VRAM_read();
    increment_ppu_address(RAM[0x2000]);
  }
  else if (uVar2 == 0x4016) {
    uVar1 = read_controller();
    return uVar1;
  }
  return uVar1;
}

Assistant:

uint8_t read_RAM(uint16_t address) {
    address = sanitize_RAM_address(address);
    uint8_t retval = RAM[address];

    if(address == PPUSTATUS_ADDRESS) {
        clear_vblank_bit();
        clear_write_toggle();
    }
    else if(address == PPUDATA_ADDRESS) {
        retval = PPUDATA_VRAM_read();
        increment_ppu_address(RAM[PPUCTRL_ADDRESS]);
    }
    else if(address == OAMDATA_ADDRESS)
        retval = get_OAM_data();
    else if(address == JOYPAD1_ADDRESS)
        retval = read_controller();

    return retval;
}